

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O0

idx_t __thiscall
duckdb::StrfTimeFormat::GetLength
          (StrfTimeFormat *this,date_t date,dtime_t time,int32_t utc_offset,char *tz_name)

{
  bool bVar1;
  undefined4 in_ECX;
  dtime_t in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined8 in_R8;
  int32_t data [8];
  int32_t *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int32_t *in_stack_ffffffffffffffa8;
  date_t in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  StrfTimeFormat *in_stack_ffffffffffffffc8;
  date_t date_00;
  idx_t local_8;
  
  date_00.days = (int32_t)((ulong)in_R8 >> 0x20);
  bVar1 = ::std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::empty
                    ((vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (bVar1) {
    local_8 = *(idx_t *)(in_RDI + 0x58);
  }
  else {
    Date::Convert(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
                  (int32_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
    Time::Convert(in_RDX,(int32_t *)&stack0xffffffffffffffb4,(int32_t *)&stack0xffffffffffffffb8,
                  (int32_t *)&stack0xffffffffffffffbc,(int32_t *)&stack0xffffffffffffffc0);
    local_8 = GetLength(in_stack_ffffffffffffffc8,date_00,
                        (int32_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffc0 * 1000),
                        in_stack_ffffffffffffffb8);
  }
  return local_8;
}

Assistant:

idx_t StrfTimeFormat::GetLength(date_t date, dtime_t time, int32_t utc_offset, const char *tz_name) {
	if (!var_length_specifiers.empty()) {
		int32_t data[8];
		Date::Convert(date, data[0], data[1], data[2]);
		Time::Convert(time, data[3], data[4], data[5], data[6]);
		data[6] *= Interval::NANOS_PER_MICRO;
		data[7] = utc_offset;
		return GetLength(date, data, tz_name);
	}
	return constant_size;
}